

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O3

void __thiscall
data_structures::
SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
::~SymbolTable(SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
               *this)

{
  size_t *psVar1;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar2;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar3;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar4;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  
  this->_vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010cab8;
  pLVar3 = (this->_list)._tail;
  pLVar4 = (this->_list)._header;
  while (pLVar4 != pLVar3) {
    pLVar2 = pLVar4->_next;
    if (pLVar2 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      pLVar4->_next = pLVar2->_next;
      (*pLVar2->_vptr_ListNode[1])(pLVar2);
      pLVar3 = (this->_list)._tail;
    }
    if (pLVar2 == pLVar3) {
      (this->_list)._tail = pLVar4;
      pLVar3 = pLVar4;
    }
    psVar1 = &(this->_list)._size;
    *psVar1 = *psVar1 - 1;
    pLVar4 = (this->_list)._header;
  }
  (this->_list)._tail = pLVar4;
  (this->_list)._size = 0;
  (this->_list)._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cae8;
  if (pLVar4 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 *)0x0) {
    (*pLVar4->_vptr_ListNode[1])(pLVar4);
  }
  (this->_list)._header =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (this->_list)._tail =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (this->_list)._size = 0;
  return;
}

Assistant:

inline
    SymbolTable<Key, Value>::~SymbolTable() {
        _list.clear();
    }